

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_shexp.hpp
# Opt level: O3

int anon_unknown.dwarf_3bba2::loadlut_cpu(void)

{
  long lVar1;
  int extraout_EAX;
  long *plVar2;
  istream *piVar3;
  undefined8 *puVar4;
  long *plVar5;
  int i_1;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int i;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  string filename;
  ifstream fin;
  float magn [1024];
  float b [1024];
  float a [1024];
  long *local_3260;
  long local_3258;
  long local_3250;
  long lStack_3248;
  undefined2 *local_3240 [2];
  undefined2 local_3230 [8];
  byte abStack_3220 [488];
  float local_3038 [1024];
  float afStack_2038 [1024];
  float afStack_1038 [1026];
  
  github111116::ConsoleLogger::log<char[30]>
            (&console,(char (*) [30])"loading log & OL lut (CPU)...");
  local_3240[0] = local_3230;
  std::__cxx11::string::_M_construct((ulong)local_3240,'\x02');
  *local_3240[0] = 0x3531;
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_3240,0,(char *)0x0,0x196bbd);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_3250 = *plVar5;
    lStack_3248 = plVar2[3];
    local_3260 = &local_3250;
  }
  else {
    local_3250 = *plVar5;
    local_3260 = (long *)*plVar2;
  }
  local_3258 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_3240[0] != local_3230) {
    operator_delete(local_3240[0]);
  }
  std::ifstream::ifstream(local_3240,(string *)&local_3260,_S_in);
  if ((abStack_3220[*(long *)(local_3240[0] + -0xc)] & 5) != 0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "cannot open lut";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  lVar12 = 0;
  lVar10 = 0;
  do {
    lVar11 = 0;
    fVar14 = 0.0;
    lVar6 = lVar12;
    do {
      std::istream::_M_extract<float>((float *)local_3240);
      bVar13 = lVar11 != 0;
      lVar11 = lVar11 + -1;
      if (bVar13) {
        fVar14 = fVar14 + *(float *)((anonymous_namespace)::log_lut + lVar6) *
                          *(float *)((anonymous_namespace)::log_lut + lVar6);
      }
      lVar6 = lVar6 + 4;
    } while (lVar11 != -0xf);
    if (fVar14 < 0.0) {
      fVar14 = sqrtf(fVar14);
    }
    else {
      fVar14 = SQRT(fVar14);
    }
    local_3038[lVar10] = fVar14;
    piVar3 = std::istream::_M_extract<float>((float *)local_3240);
    std::istream::_M_extract<float>((float *)piVar3);
    lVar11 = (anonymous_namespace)::b_lut;
    lVar6 = (anonymous_namespace)::a_lut;
    lVar10 = lVar10 + 1;
    lVar12 = lVar12 + 0x3c;
  } while (lVar10 != 0x400);
  lVar10 = 0;
  fVar14 = 0.0;
  do {
    fVar15 = local_3038[lVar10];
    if (local_3038[lVar10] <= fVar14) {
      fVar15 = fVar14;
    }
    lVar10 = lVar10 + 1;
    fVar14 = fVar15;
  } while (lVar10 != 0x400);
  lVar10 = 0;
  iVar8 = 0;
  (anonymous_namespace)::max_magn = fVar15;
  do {
    fVar14 = (float)(int)lVar10 / 1023.0;
    fVar14 = fVar14 * fVar15 + (1.0 - fVar14) * local_3038[0];
    lVar12 = (long)iVar8;
    iVar9 = 0x3ff;
    if (0x3ff < iVar8) {
      iVar9 = iVar8;
    }
    iVar7 = iVar8 + -1;
    do {
      iVar8 = iVar9;
      if (0x3fe < lVar12) break;
      iVar8 = iVar7 + 1;
      lVar1 = lVar12 + 1;
      lVar12 = lVar12 + 1;
      iVar7 = iVar8;
    } while (local_3038[lVar1] <= fVar14 && fVar14 != local_3038[lVar1]);
    fVar14 = (fVar14 - local_3038[iVar8]) / (local_3038[(long)iVar8 + 1] - local_3038[iVar8]);
    *(float *)(lVar6 + lVar10 * 4) =
         afStack_1038[iVar8] * (1.0 - fVar14) + afStack_1038[(long)iVar8 + 1] * fVar14;
    *(float *)(lVar11 + lVar10 * 4) =
         (1.0 - fVar14) * afStack_2038[iVar8] + fVar14 * afStack_2038[(long)iVar8 + 1];
    lVar10 = lVar10 + 1;
    if (lVar10 == 0x400) {
      iVar8 = std::ifstream::~ifstream(local_3240);
      if (local_3260 != &local_3250) {
        operator_delete(local_3260);
        iVar8 = extraout_EAX;
      }
      return iVar8;
    }
  } while( true );
}

Assistant:

int loadlut_cpu()
	{
		const int n = shorder;
		console.log("loading log & OL lut (CPU)...");
		float a[n_entry], b[n_entry], magn[n_entry];
		// read lut from file
		std::string filename = "../lut/lut" + std::to_string(n);
		std::ifstream fin(filename);
		if (!fin) throw "cannot open lut";
		for (int i=0; i<n_entry; ++i)
		{
			// calculate magnitude of f_hat (f without DC component)
			float s = 0;
			for (int j=0; j<n; ++j) {
				fin >> log_lut[i].a[j];
				if (j>0)
					s += log_lut[i].a[j] * log_lut[i].a[j];
			}
			magn[i] = sqrt(s);
			fin >> a[i] >> b[i];
		}
		// magnitude is increasing then decreasing
		max_magn = 0;
		for (int i=0; i<n_entry; ++i)
			max_magn = std::max(max_magn, magn[i]);
		// convert AB_lut from angle-indexed to magnitude-indexed
		int current_id = 0;
		for (int i=0; i<n_entry; ++i)
		{
			float ratio = (float)i / (n_entry-1);
			float target_magn = lerp(magn[0], max_magn, ratio);
			while (current_id < n_entry-1 and target_magn > magn[current_id+1])
				current_id += 1;
			float r = (target_magn - magn[current_id]) / (magn[current_id+1] - magn[current_id]);
			a_lut[i] = lerp(a[current_id], a[current_id+1], r);
			b_lut[i] = lerp(b[current_id], b[current_id+1], r);
		}
		return 0;
	}